

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

void __thiscall Inline::CloneCallSequence(Inline *this,Instr *callInstr,Instr *clonedCallInstr)

{
  anon_class_24_3_6040f5ac callback;
  Instr *this_00;
  Opnd *pOVar1;
  StackSym *this_01;
  Instr *this_02;
  Instr *startCall;
  Instr *local_30;
  Instr *previousClonedArg;
  Instr *previousArg;
  Instr *clonedCallInstr_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  previousClonedArg = (Instr *)0x0;
  callback.previousClonedArg = &local_30;
  callback.callInstr = &clonedCallInstr_local;
  callback.previousArg = &previousClonedArg;
  local_30 = clonedCallInstr;
  previousArg = clonedCallInstr;
  clonedCallInstr_local = callInstr;
  callInstr_local = (Instr *)this;
  IR::Instr::IterateArgInstrs<Inline::CloneCallSequence(IR::Instr*,IR::Instr*)::__0>
            (callInstr,callback);
  pOVar1 = IR::Instr::GetSrc2(previousClonedArg);
  this_01 = IR::Opnd::GetStackSym(pOVar1);
  this_02 = StackSym::GetInstrDef(this_01);
  this_00 = local_30;
  pOVar1 = IR::Instr::GetDst(this_02);
  IR::Instr::SetSrc2(this_00,pOVar1);
  return;
}

Assistant:

void Inline::CloneCallSequence(IR::Instr* callInstr, IR::Instr* clonedCallInstr)
{
    IR::Instr* previousArg = nullptr;
    IR::Instr* previousClonedArg = clonedCallInstr;
    callInstr->IterateArgInstrs([&](IR::Instr* argInstr){
        IR::Instr* cloneArg = IR::Instr::New(argInstr->m_opcode,
            IR::SymOpnd::New(callInstr->m_func->m_symTable->GetArgSlotSym(argInstr->GetDst()->GetStackSym()->GetArgSlotNum()), 0, argInstr->GetDst()->GetType(), callInstr->m_func),
            argInstr->GetSrc1(), callInstr->m_func);
        cloneArg->SetByteCodeOffset(callInstr);
        cloneArg->GetDst()->GetStackSym()->m_isArgCaptured = true;
        previousClonedArg->SetSrc2(cloneArg->GetDst());
        previousClonedArg->InsertBefore(cloneArg);
        previousArg = argInstr;
        previousClonedArg = cloneArg;
        return false;
    });
    IR::Instr* startCall = previousArg->GetSrc2()->GetStackSym()->GetInstrDef();
    previousClonedArg->SetSrc2(startCall->GetDst());

}